

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Argument *pAVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  string *input;
  string *output;
  string_view aArgumentName;
  string_view aArgumentName_00;
  string_view aArgumentName_01;
  string_view aArgumentName_02;
  string_view aArgumentName_03;
  string_view aArgumentName_04;
  string_view aArgumentName_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_file;
  ArgumentParser program;
  ifstream inf;
  ofstream outf;
  long *local_670;
  long local_668;
  long local_660;
  long lStack_658;
  any local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  char **local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  any local_5d8;
  any local_5c8;
  any local_5b8;
  string local_5a8;
  any local_588;
  any local_578;
  any local_568;
  ArgumentParser local_558;
  long *local_4d8 [2];
  long local_4c8 [2];
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428;
  undefined7 uStack_427;
  undefined8 uStack_420;
  byte abStack_418 [488];
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_620 = argv;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"cc0","");
  argparse::ArgumentParser::ArgumentParser(&local_558,&local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"-s");
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,"Translate the input c0 source code into a text assembly file","");
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,(string *)local_498);
  local_5b8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5b8._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar3->mDefaultValue,&local_5b8);
  local_568._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_568._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar3->mImplicitValue,&local_568);
  pAVar3->mNumArgs = 0;
  if (local_568._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_568._M_manager)(_Op_destroy,&local_568,(_Arg *)0x0);
    local_568._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_5b8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_5b8._M_manager)(_Op_destroy,&local_5b8,(_Arg *)0x0);
    local_5b8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"-c");
  local_4b8[0] = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b8,"Translate the input c0 source code into a binary object file","");
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,(string *)local_4b8);
  local_5c8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5c8._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar3->mDefaultValue,&local_5c8);
  local_578._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_578._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar3->mImplicitValue,&local_578);
  pAVar3->mNumArgs = 0;
  if (local_578._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_578._M_manager)(_Op_destroy,&local_578,(_Arg *)0x0);
    local_578._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_5c8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_5c8._M_manager)(_Op_destroy,&local_5c8,(_Arg *)0x0);
    local_5c8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_4b8[0] != local_4a8) {
    operator_delete(local_4b8[0],local_4a8[0] + 1);
  }
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"-h");
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d8,"Shows help with compiler usage","");
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,(string *)local_4d8);
  local_5d8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5d8._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar3->mDefaultValue,&local_5d8);
  local_588._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_588._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar3->mImplicitValue,&local_588);
  pAVar3->mNumArgs = 0;
  if (local_588._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_588._M_manager)(_Op_destroy,&local_588,(_Arg *)0x0);
    local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_5d8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_5d8._M_manager)(_Op_destroy,&local_5d8,(_Arg *)0x0);
    local_5d8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"-o");
  local_438 = &local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"out","");
  local_650._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_650._M_storage._M_ptr = (void *)0x0;
  local_650._M_storage._M_ptr = operator_new(0x20);
  *(undefined8 **)local_650._M_storage._M_ptr =
       (undefined8 *)((long)local_650._M_storage._M_ptr + 0x10);
  if (local_438 == &local_428) {
    *(undefined8 *)((long)local_650._M_storage._M_ptr + 0x10) = CONCAT71(uStack_427,local_428);
    *(undefined8 *)((long)local_650._M_storage._M_ptr + 0x18) = uStack_420;
  }
  else {
    *(undefined1 **)local_650._M_storage._M_ptr = local_438;
    *(ulong *)((long)local_650._M_storage._M_ptr + 0x10) = CONCAT71(uStack_427,local_428);
  }
  *(undefined8 *)((long)local_650._M_storage._M_ptr + 8) = local_430;
  local_430 = 0;
  local_428 = 0;
  local_438 = &local_428;
  std::any::operator=(&pAVar3->mDefaultValue,&local_650);
  pAVar3->field_0xbc = pAVar3->field_0xbc | 2;
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"specify the output file.","")
  ;
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,(string *)local_458);
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (local_650._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_650._M_manager)(_Op_destroy,&local_650,(_Arg *)0x0);
    local_650._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_438 != &local_428) {
    operator_delete(local_438,CONCAT71(uStack_427,local_428) + 1);
  }
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"input");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"specify the input file.","");
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,(string *)local_478);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0],local_468[0] + 1);
  }
  argparse::ArgumentParser::parse_args(&local_558,argc,local_620);
  aArgumentName._M_str = "input";
  aArgumentName._M_len = 5;
  pAVar3 = argparse::ArgumentParser::operator[](&local_558,aArgumentName);
  argparse::Argument::get<std::__cxx11::string>(&local_5f8,pAVar3);
  aArgumentName_00._M_str = "-o";
  aArgumentName_00._M_len = 2;
  pAVar3 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_00);
  argparse::Argument::get<std::__cxx11::string>(&local_618,pAVar3);
  std::ifstream::ifstream(&local_438);
  std::ofstream::ofstream(&local_230);
  iVar2 = std::__cxx11::string::compare((char *)&local_5f8);
  if (iVar2 != 0) {
    input = (string *)&local_438;
    std::ifstream::open(input,(_Ios_Openmode)&local_5f8);
    if ((abStack_418[*(long *)(local_438 + -0x18)] & 5) == 0) goto LAB_00105cae;
    std::operator+(&local_640,"Fail to open ",&local_5f8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_640);
    local_670 = (long *)*plVar4;
    plVar6 = plVar4 + 2;
    if (local_670 == plVar6) {
      local_660 = *plVar6;
      lStack_658 = plVar4[3];
      local_670 = &local_660;
    }
    else {
      local_660 = *plVar6;
    }
    local_668 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::operator<<((ostream *)&std::cout,(string *)&local_670);
LAB_00105fa8:
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)&local_640);
LAB_00105fbc:
    exit(2);
  }
  input = (string *)&std::cin;
LAB_00105cae:
  iVar2 = std::__cxx11::string::compare((char *)&local_618);
  if (iVar2 == 0) {
    output = (string *)&std::cout;
  }
  else {
    aArgumentName_01._M_str = "-c";
    aArgumentName_01._M_len = 2;
    pAVar3 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_01);
    argparse::Argument::get<bool>(pAVar3);
    output = (string *)&local_230;
    std::ofstream::open(output,(_Ios_Openmode)&local_618);
    if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
      std::operator+(&local_640,"Fail to open ",&local_618);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_640);
      local_670 = (long *)*puVar5;
      plVar4 = puVar5 + 2;
      if (local_670 == plVar4) {
        local_660 = *plVar4;
        lStack_658 = puVar5[3];
        local_670 = &local_660;
      }
      else {
        local_660 = *plVar4;
      }
      local_668 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::operator<<((ostream *)&std::cout,(string *)&local_670);
      goto LAB_00105fa8;
    }
  }
  aArgumentName_02._M_str = "-s";
  aArgumentName_02._M_len = 2;
  pAVar3 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_02);
  bVar1 = argparse::Argument::get<bool>(pAVar3);
  if (bVar1) {
    aArgumentName_03._M_str = "-c";
    aArgumentName_03._M_len = 2;
    pAVar3 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_03);
    bVar1 = argparse::Argument::get<bool>(pAVar3);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,
                      "You can only perform tokenization or syntactic analysis at one time.");
      goto LAB_00105fbc;
    }
  }
  aArgumentName_04._M_str = "-s";
  aArgumentName_04._M_len = 2;
  pAVar3 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_04);
  bVar1 = argparse::Argument::get<bool>(pAVar3);
  if (bVar1) {
    assembler((istream *)input,(ostream *)output);
  }
  else {
    aArgumentName_05._M_str = "-c";
    aArgumentName_05._M_len = 2;
    pAVar3 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_05);
    bVar1 = argparse::Argument::get<bool>(pAVar3);
    if (!bVar1) {
      std::operator<<((ostream *)&std::cout,"You must choose -c or -s.");
      goto LAB_00105fbc;
    }
    compiler((istream *)input,(ostream *)output);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sentry;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  std::ifstream::~ifstream(&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::~_Rb_tree(&local_558.mArgumentMap._M_t);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&local_558.mOptionalArguments.
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&local_558.mPositionalArguments.
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558.mProgramName._M_dataplus._M_p != &local_558.mProgramName.field_2) {
    operator_delete(local_558.mProgramName._M_dataplus._M_p,
                    local_558.mProgramName.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {

	argparse::ArgumentParser program("cc0");

	program.add_argument("-s")
		.help("Translate the input c0 source code into a text assembly file")
		.default_value(false)
		.implicit_value(true);

	program.add_argument("-c")
		.help("Translate the input c0 source code into a binary object file")
		.default_value(false)
		.implicit_value(true);

	program.add_argument("-h")
		.help("Shows help with compiler usage")
		.default_value(false)
		.implicit_value(true);

	program.add_argument("-o")
		.default_value(std::string("out"))
		.required()
		.help("specify the output file.");

	program.add_argument("input")
		.help("specify the input file.");


	try {
		program.parse_args(argc, argv);
	}
	catch (const std::runtime_error & err) {
		std::cout << err.what() << std::endl;
		std::cout << program;
		exit(0);
	}

	auto input_file = program.get<std::string>("input");
	auto output_file = program.get<std::string>("-o");
	std::istream* input;
	std::ostream* output;
	std::ifstream inf;
	std::ofstream outf;
	if (input_file != "-") {
		inf.open(input_file, std::ios::in);
		if (!inf) {
			std::cout << "Fail to open "+ input_file+" for reading.\n";
			exit(2);
		}
		input = &inf;
	}
	else
		input = &std::cin;
	if (output_file != "-") {
		if (program["-c"] == true) {
			outf.open(output_file, std::ios::binary| std::ios::trunc);
		}
		else {
			outf.open(output_file, std::ios::out | std::ios::trunc);
		}
		if (!outf) {
			std::cout << "Fail to open " + output_file + " for writing.\n";
			exit(2);
		}
		output = &outf;
	}
	else
		output = &std::cout;

	if (program["-s"] == true && program["-c"] == true) {
		std::cout << "You can only perform tokenization or syntactic analysis at one time.";
		exit(2);
	}
	if (program["-s"] == true) {
		assembler(*input, *output);
	}
	else if (program["-c"] == true) {
		compiler(*input, *output);
	}
	else {
		std::cout << "You must choose -c or -s.";
		exit(2);
	}

	return 0;
}